

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  sysbvm_tuple_t sVar4;
  undefined8 *puVar5;
  anon_struct_40_5_caec50dc gcFrame;
  sysbvm_object_tuple_t *local_68;
  sysbvm_object_tuple_t *psStack_60;
  sysbvm_object_tuple_t *local_58;
  sysbvm_object_tuple_t *psStack_50;
  undefined8 local_48;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_58 = (sysbvm_object_tuple_t *)0x0;
  psStack_50 = (sysbvm_object_tuple_t *)0x0;
  local_68 = (sysbvm_object_tuple_t *)0x0;
  psStack_60 = (sysbvm_object_tuple_t *)0x0;
  local_48 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  local_20 = (undefined1 *)&local_68;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_68 = sysbvm_context_allocatePointerTuple
                       (context,(context->roots).functionBytecodeAssemblerLabel,7);
  psStack_60 = sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionBytecodeAssemblerLabel,7);
  local_58 = sysbvm_context_allocatePointerTuple
                       (context,(context->roots).functionBytecodeAssemblerLabel,7);
  psStack_50 = sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionBytecodeAssemblerLabel,7);
  lVar1 = *(long *)(arguments[1] + 0x10);
  lVar2 = *(long *)(lVar1 + 0x50);
  local_68[1].header.identityHashAndFlags = (int)lVar2;
  local_68[1].header.objectSize = (int)((ulong)lVar2 >> 0x20);
  puVar5 = (undefined8 *)(lVar2 + 0x28);
  if (lVar2 == 0) {
    puVar5 = (undefined8 *)(lVar1 + 0x48);
  }
  *puVar5 = local_68;
  *(sysbvm_object_tuple_t **)(lVar1 + 0x50) = local_68;
  local_68[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar1 + 0x68);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  local_68[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar1 + 0x58);
  local_68[2].header.identityHashAndFlags = (int)uVar3;
  local_68[2].header.objectSize = (int)((ulong)uVar3 >> 0x20);
  if (*(sysbvm_tuple_t *)(*arguments + 0x28) == 0) {
    sysbvm_functionBytecodeAssembler_jump
              (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->assembler,
               (sysbvm_tuple_t)psStack_60);
  }
  else {
    sVar4 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                       *(sysbvm_tuple_t *)(*arguments + 0x28));
    sysbvm_functionBytecodeAssembler_jumpIfFalse
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sVar4,
               (sysbvm_tuple_t)psStack_50);
  }
  lVar1 = *(long *)(arguments[1] + 0x10);
  lVar2 = *(long *)(lVar1 + 0x50);
  psStack_60[1].header.identityHashAndFlags = (int)lVar2;
  psStack_60[1].header.objectSize = (int)((ulong)lVar2 >> 0x20);
  puVar5 = (undefined8 *)(lVar2 + 0x28);
  if (lVar2 == 0) {
    puVar5 = (undefined8 *)(lVar1 + 0x48);
  }
  *puVar5 = psStack_60;
  *(sysbvm_object_tuple_t **)(lVar1 + 0x50) = psStack_60;
  psStack_60[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar1 + 0x68);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  psStack_60[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar1 + 0x58);
  psStack_60[2].header.identityHashAndFlags = (int)uVar3;
  psStack_60[2].header.objectSize = (int)((ulong)uVar3 >> 0x20);
  if (*(sysbvm_tuple_t *)(*arguments + 0x30) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
               *(sysbvm_tuple_t *)(*arguments + 0x30),(sysbvm_tuple_t)psStack_50,
               (sysbvm_tuple_t)local_58);
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
             (sysbvm_tuple_t)local_58);
  lVar1 = *(long *)(arguments[1] + 0x10);
  lVar2 = *(long *)(lVar1 + 0x50);
  local_58[1].header.identityHashAndFlags = (int)lVar2;
  local_58[1].header.objectSize = (int)((ulong)lVar2 >> 0x20);
  puVar5 = (undefined8 *)(lVar2 + 0x28);
  if (lVar2 == 0) {
    puVar5 = (undefined8 *)(lVar1 + 0x48);
  }
  *puVar5 = local_58;
  *(sysbvm_object_tuple_t **)(lVar1 + 0x50) = local_58;
  local_58[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar1 + 0x68);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  local_58[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar1 + 0x58);
  local_58[2].header.identityHashAndFlags = (int)uVar3;
  local_58[2].header.objectSize = (int)((ulong)uVar3 >> 0x20);
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNode
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
               *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
             (sysbvm_tuple_t)local_68);
  lVar1 = *(long *)(arguments[1] + 0x10);
  lVar2 = *(long *)(lVar1 + 0x50);
  psStack_50[1].header.identityHashAndFlags = (int)lVar2;
  psStack_50[1].header.objectSize = (int)((ulong)lVar2 >> 0x20);
  puVar5 = (undefined8 *)(lVar2 + 0x28);
  if (lVar2 == 0) {
    puVar5 = (undefined8 *)(lVar1 + 0x48);
  }
  *puVar5 = psStack_50;
  *(sysbvm_object_tuple_t **)(lVar1 + 0x50) = psStack_50;
  psStack_50[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar1 + 0x68);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  psStack_50[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar1 + 0x58);
  psStack_50[2].header.identityHashAndFlags = (int)uVar3;
  psStack_50[2].header.objectSize = (int)((ulong)uVar3 >> 0x20);
  sysbvm_stackFrame_popRecord(&local_38);
  sVar4 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f);
  return sVar4;
}

Assistant:

static sysbvm_tuple_t sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astWhileContinueWithNode_t **whileNode = (sysbvm_astWhileContinueWithNode_t**)node;
    struct {
        sysbvm_tuple_t whileEntryLabel;
        sysbvm_tuple_t whileBodyLabel;
        sysbvm_tuple_t whileContinue;
        sysbvm_tuple_t whileMergeLabel;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.whileEntryLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileBodyLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileContinue = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileMergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // While condition block.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileEntryLabel);
    if((*whileNode)->conditionExpression)
    {
        sysbvm_tuple_t condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*whileNode)->conditionExpression);
        sysbvm_functionBytecodeAssembler_jumpIfFalse(context, (*compiler)->assembler, condition, gcFrame.whileMergeLabel);
    }
    else
    {
        sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileBodyLabel);
    }

    // While body.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileBodyLabel);
    if((*whileNode)->bodyExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue(context, *compiler, (*whileNode)->bodyExpression, gcFrame.whileMergeLabel, gcFrame.whileContinue);
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileContinue);

    // While continue
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileContinue);
    if((*whileNode)->continueExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*whileNode)->continueExpression);

    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileEntryLabel);

    // While merge
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileMergeLabel);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
}